

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O3

void __thiscall leveldb::_Test_TableFile::_Run(_Test_TableFile *this)

{
  DBImpl *this_00;
  DB local_20;
  
  CorruptionTest::Build(&this->super_CorruptionTest,100);
  this_00 = (DBImpl *)(this->super_CorruptionTest).db_;
  DBImpl::TEST_CompactMemTable((DBImpl *)&stack0xffffffffffffffe0);
  if (local_20._vptr_DB != (_func_int **)0x0) {
    operator_delete__(local_20._vptr_DB);
  }
  DBImpl::TEST_CompactRange(this_00,0,(Slice *)0x0,(Slice *)0x0);
  DBImpl::TEST_CompactRange(this_00,1,(Slice *)0x0,(Slice *)0x0);
  CorruptionTest::Corrupt(&this->super_CorruptionTest,kTableFile,100,1);
  CorruptionTest::Check(&this->super_CorruptionTest,0x5a,99);
  return;
}

Assistant:

TEST(CorruptionTest, TableFile) {
  Build(100);
  DBImpl* dbi = reinterpret_cast<DBImpl*>(db_);
  dbi->TEST_CompactMemTable();
  dbi->TEST_CompactRange(0, nullptr, nullptr);
  dbi->TEST_CompactRange(1, nullptr, nullptr);

  Corrupt(kTableFile, 100, 1);
  Check(90, 99);
}